

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f,int horn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  param_t *ppVar3;
  int z;
  float fVar4;
  double dVar5;
  double dVar6;
  int local_48;
  int local_44;
  int k;
  int j;
  int i;
  param_t P;
  int horn_local;
  qnode_ptr_t f_local;
  qnode_ptr_t c_local;
  
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (local_44 = f->ofst; local_44 < f->sizx - f->ofst; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < f->sizz; local_48 = local_48 + 1) {
        fVar4 = dx(c,f,k,local_44,local_48);
        (*f->param_ptr[local_48])[f->res * k + local_44].fx = fVar4;
        fVar4 = dy(c,f,k,local_44,local_48);
        (*f->param_ptr[local_48])[f->res * k + local_44].fy = fVar4;
      }
    }
  }
  z = c->sizz / 2;
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (local_44 = f->ofst; local_44 < f->sizx - f->ofst; local_44 = local_44 + 1) {
      if ((*f->param_ptr[z])[f->res * k + local_44].err == 0) {
        fVar4 = dt(c,f,k,local_44);
        (*f->param_ptr[z])[f->res * k + local_44].ft = fVar4;
      }
    }
  }
  if (horn == 0) {
    for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
      for (local_44 = f->ofst; local_44 < f->sizx - f->ofst; local_44 = local_44 + 1) {
        if ((*f->param_ptr[z])[f->res * k + local_44].err == 0) {
          fVar4 = dxx(f,k,local_44,z);
          (*f->param_ptr[z])[f->res * k + local_44].fxx = fVar4;
          fVar4 = dyy(f,k,local_44,z);
          (*f->param_ptr[z])[f->res * k + local_44].fyy = fVar4;
          fVar4 = dxy(f,k,local_44,z);
          (*f->param_ptr[z])[f->res * k + local_44].fxy = fVar4;
        }
      }
    }
  }
  for (k = f->ofst; k < f->sizy - f->ofst; k = k + 1) {
    for (local_44 = f->ofst; local_44 < f->sizx - f->ofst; local_44 = local_44 + 1) {
      if ((*f->param_ptr[z])[f->res * k + local_44].err == 0) {
        ppVar3 = *f->param_ptr[z] + (f->res * k + local_44);
        uVar1 = ppVar3->fx;
        uVar2 = ppVar3->fy;
        dVar5 = pow((double)(float)uVar1,2.0);
        dVar6 = pow((double)(float)uVar2,2.0);
        dVar5 = sqrt(dVar5 + dVar6);
        (*f->param_ptr[z])[f->res * k + local_44].mag = (float)dVar5;
      }
    }
  }
  return;
}

Assistant:

void compute_deriv(qnode_ptr_t c, qnode_ptr_t f, int horn)
{ float dxx(), dyy(), dxy(), dx(), dy(), dt() ;
  param_t P ;
  int i, j, k ;

  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
      }
    }
  }
  if (!horn) {
    for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
      for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
        if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
          (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
          (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
        }
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        P = (*f->param_ptr[k])[f->res*i + j] ;
        (*f->param_ptr[k])[f->res*i + j].mag =
        sqrt(pow(P.fx,2.0) + pow(P.fy,2.0)) ;
      }
    }
  }
}